

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void __thiscall TestMaterial::TestPrecision(TestMaterial *this)

{
  void *__s;
  double *__s_00;
  clock_t cVar1;
  long lVar2;
  clock_t cVar3;
  ostream *poVar4;
  long i;
  ulong uVar5;
  value_type_conflict1 *__val;
  double *pdVar6;
  long lVar7;
  double dVar8;
  long local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TestPrecision",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  __s = operator_new(240000);
  memset(__s,0,240000);
  __s_00 = (double *)operator_new(80000);
  memset(__s_00,0,80000);
  *(undefined8 *)(sch::S_Object::setOrientation + *(long *)(std::cout + -0x18)) = 0x12;
  sch::CD_Scene::sceneProximityQuery();
  display();
  local_50 = 2;
  uVar5 = 0;
  pdVar6 = __s_00;
  do {
    dVar8 = sin((double)(long)(uVar5 + ((uVar5 % 0x57) / 3) * -3 + (uVar5 / 0x57) * -0x57) *
                0.02519999848800003);
    *(double *)((long)__s + local_50 * 8 + -0x10) = dVar8;
    dVar8 = sin((double)(long)(uVar5 + ((uVar5 % 0x49) / 3) * -3 + (uVar5 / 0x49) * -0x49) *
                -0.025799998452000032);
    *(double *)((long)__s + local_50 * 8 + -8) = dVar8;
    dVar8 = cos((double)(long)(uVar5 + ((uVar5 % 0x59) / 3) * -3 + (uVar5 / 0x59) * -0x59) *
                0.024899999626500004);
    *(double *)((long)__s + local_50 * 8) = dVar8;
    dVar8 = sin((double)(long)(uVar5 + ((uVar5 % 0x4f) / 3) * -3 + (uVar5 / 0x4f) * -0x4f) *
                0.02909998865100172);
    *pdVar6 = dVar8 * 4.0;
    uVar5 = uVar5 + 1;
    local_50 = local_50 + 3;
    pdVar6 = pdVar6 + 1;
  } while (local_50 != 0x7532);
  lVar7 = 0;
  cVar1 = clock();
  do {
    lVar2 = *(long *)&this->field_0x8;
    if (*(long *)&this->field_0x10 != lVar2) {
      uVar5 = 0;
      do {
        sch::S_Object::addRotation(*(double **)(lVar2 + uVar5 * 8),(Vector3T *)(__s_00 + lVar7));
        uVar5 = uVar5 + 1;
        lVar2 = *(long *)&this->field_0x8;
      } while (uVar5 < (ulong)(*(long *)&this->field_0x10 - lVar2 >> 3));
    }
    sch::CD_Scene::sceneProximityQuery();
    display();
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10000);
  cVar3 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  computation time: ",0x14);
  dVar8 = (double)(cVar3 - cVar1) / 1000000.0;
  poVar4 = std::ostream::_M_insert<double>(dVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
  poVar4 = std::ostream::_M_insert<double>(dVar8 / 10000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  operator_delete(__s_00,80000);
  operator_delete(__s,240000);
  return;
}

Assistant:

void TestMaterial::TestPrecision()
{
  std::cout << "TestPrecision" << std::endl;

  std::vector<Vector3> axe(AnimationEnd) ;
  std::vector<double> angle(AnimationEnd) ;

  std::cout.precision(18);

#ifdef DO_TEST
  sObj.sceneProximityQuery();
#endif

  display();

  clock_t begin, end;



#ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_precisiontest_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
#endif


#ifdef IRREGULARITIES_COUNTERS
  Scalar previousDistance=2e90;
  int irrCpt=0;
#endif


#ifdef COLLISION_COUNTERS
  int collCpt=0;
  int totalCpt=0;
#endif



  for (long i=0; i<AnimationEnd; i++)
  {
    axe[i][0] =  sin((42)*sin(0.2*AnimationSpeed)*Scalar(i%87%3));
    axe[i][1] =  sin((-43)*sin(0.2*AnimationSpeed)*Scalar(i%73%3));
    axe[i][2] =  cos((83)*sin(0.1*AnimationSpeed)*Scalar(i%89%3));

    angle[i]=4*sin((97)*sin(0.2*sin(0.5*AnimationSpeed))*Scalar(i%79%3));

    /*sObj[j]->addTranslation(Vector3(sin((20*(1))*sin(0.2*AnimationSpeed))*(i%67%3),
    sin((71-140*(1))*sin(0.15*AnimationSpeed))*(i%59%3),
    sin((20)*sin(0.2*AnimationSpeed*(i%93%3))))*AnimationScale);
    */
  }



  begin=clock();
  for (long i=0; i<AnimationEnd; i++)
  {
    for (size_t j=0; j<sObj.size(); j++)
      sObj[j]->addRotation(angle[i],axe[i]);

#ifdef DO_TEST
    sObj.sceneProximityQuery();

    for (unsigned k=0; k<sObj.size(); k++)
    {
      for (unsigned j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
# ifndef OUTPUT_FILE
        (void) distance; ///preventing unsused variable warning
#else
        outfile<<p1<<p2<<distance<<std::endl;
# endif
      }
    }

#ifdef IRREGULARITIES_COUNTERS
    Point3 p1,p2;
    Scalar distance=sObj.getWitnessPoints(0,1,p1,p2);
    Scalar distance2=(p1-p2).normsquared();
    if (previousDistance!=2e90)
    {
      if (fabs(fabs(distance)-distance2)>(0.001*(fabs(distance)+distance2)/2))
      {
        irrCpt++;
        std::cout<<"Witness Points Irregularity : "<<i<<' '<<distance<<' '<<distance2<<std::endl;
      }
      if (fabs(distance-previousDistance)>0.1)
      {
        irrCpt++;
        std::cout<<"Coherence Irregularity : "<<i;
      }
    }
    previousDistance=distance;
#endif

#ifdef COLLISION_COUNTERS
    for (int k=0; k<sObj.size(); k++)
    {
      for (int j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
        if (distance<0)
          collCpt++;
        totalCpt++;
      }
    }
#endif

#endif


#ifdef TEST_HOLD
    std::cout<<i<<std::endl;
    system("pause");
#endif

    display();
  }

  end=clock();


#ifdef OUTPUT_FILE
  outfile.close();
#endif



  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) << " : " << ((double)(end - begin) / CLOCKS_PER_SEC)/(AnimationEnd) <<  std::endl;

#ifdef IRREGULARITIES_COUNTERS
  std::cout<<"Irregularities : "<<irrCpt<<std::endl;
#endif

#ifdef COLLISION_COUNTERS
  std::cout << "Collisions : "<<collCpt<<std::endl;
#endif
}